

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64BaseInfo.h
# Opt level: O2

char * getCondCodeName(A64CC_CondCode CC)

{
  if (CC < A64CC_Invalid) {
    return &DAT_001dad58 + *(int *)(&DAT_001dad58 + (ulong)CC * 4);
  }
  return (char *)0x0;
}

Assistant:

inline static char *getCondCodeName(A64CC_CondCode CC)
{
	switch (CC) {
		default: return NULL;	// never reach
		case A64CC_EQ:  return "eq";
		case A64CC_NE:  return "ne";
		case A64CC_HS:  return "hs";
		case A64CC_LO:  return "lo";
		case A64CC_MI:  return "mi";
		case A64CC_PL:  return "pl";
		case A64CC_VS:  return "vs";
		case A64CC_VC:  return "vc";
		case A64CC_HI:  return "hi";
		case A64CC_LS:  return "ls";
		case A64CC_GE:  return "ge";
		case A64CC_LT:  return "lt";
		case A64CC_GT:  return "gt";
		case A64CC_LE:  return "le";
		case A64CC_AL:  return "al";
		case A64CC_NV:  return "nv";
	}
}